

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O0

void colorconv(char *buffer,char *txt,CHAR_DATA *ch)

{
  ulong uVar1;
  bool bVar2;
  long in_RDX;
  char *in_RSI;
  char *in_RDI;
  __type_conflict2 _Var3;
  char *unaff_retaddr;
  CHAR_DATA *in_stack_00000008;
  char in_stack_00000013;
  int skip;
  char *point;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  int local_24;
  char *local_20;
  char *local_8;
  
  if (in_RSI != (char *)0x0) {
    uVar1 = *(ulong *)(in_RDX + 0x180);
    _Var3 = std::pow<int,int>(0,0x5b3397);
    local_20 = in_RSI;
    local_8 = in_RDI;
    if (((uVar1 & (long)_Var3) != 0) || (bVar2 = is_npc(in_stack_ffffffffffffffc8), bVar2)) {
      for (; *local_20 != '\0'; local_20 = local_20 + 1) {
        if (*local_20 == '{') {
          local_20 = local_20 + 1;
          local_24 = color(in_stack_00000013,in_stack_00000008,unaff_retaddr);
          while (0 < local_24) {
            local_8 = local_8 + 1;
            local_24 = local_24 + -1;
          }
        }
        else {
          *local_8 = *local_20;
          local_8[1] = '\0';
          local_8 = local_8 + 1;
        }
      }
      *local_8 = '\0';
    }
    else {
      for (; *local_20 != '\0'; local_20 = local_20 + 1) {
        if (*local_20 == '{') {
          local_20 = local_20 + 1;
        }
        else {
          *local_8 = *local_20;
          local_8[1] = '\0';
          local_8 = local_8 + 1;
        }
      }
      *local_8 = '\0';
    }
  }
  return;
}

Assistant:

void colorconv(char *buffer, const char *txt, CHAR_DATA *ch)
{
	const char *point;
	int skip = 0;

	if (txt)
	{
		if (IS_SET(ch->act, PLR_COLOR) || is_npc(ch))
		{
			for (point = txt; *point; point++)
			{
				if (*point == '{')
				{
					point++;
					skip = color(*point, ch, buffer);

					while (skip-- > 0)
					{
						++buffer;
					}

					continue;
				}

				*buffer = *point;
				*++buffer = '\0';
			}

			*buffer = '\0';
		}
		else
		{
			for (point = txt; *point; point++)
			{
				if (*point == '{')
				{
					point++;
					continue;
				}

				*buffer = *point;
				*++buffer = '\0';
			}

			*buffer = '\0';
		}
	}
}